

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedType.cpp
# Opt level: O3

bool __thiscall hdc::NamedType::equals(NamedType *this,Type *other)

{
  ASTKind AVar1;
  ASTKind AVar2;
  Symbol *this_00;
  Symbol *this_01;
  void *pvVar3;
  void *pvVar4;
  
  AVar1 = (this->super_Type).super_ASTNode.kind;
  AVar2 = ASTNode::getKind(&other->super_ASTNode);
  if (AVar1 == AVar2) {
    this_00 = IdentifierExpression::getSymbol(this->name);
    this_01 = IdentifierExpression::getSymbol
                        ((IdentifierExpression *)other[1].super_ASTNode._vptr_ASTNode);
    if (this_01 != (Symbol *)0x0 && this_00 != (Symbol *)0x0) {
      pvVar3 = Symbol::getDescriptor(this_00);
      pvVar4 = Symbol::getDescriptor(this_01);
      return pvVar3 == pvVar4;
    }
  }
  return false;
}

Assistant:

bool NamedType::equals(Type *other) {
    Symbol* s1;
    Symbol* s2;
    NamedType* n;

    if (kind == other->getKind()) {
        n = (NamedType*) other;

        s1 = getName()->getSymbol();
        s2 = n->getName()->getSymbol();

        if (s1 != nullptr && s2 != nullptr) {
            return s1->getDescriptor() == s2->getDescriptor();
        }
    }

    return false;
}